

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O1

void __thiscall
duckdb::IEJoinLocalSourceState::IEJoinLocalSourceState
          (IEJoinLocalSourceState *this,ClientContext *context,PhysicalIEJoin *op)

{
  Allocator *pAVar1;
  const_reference this_00;
  pointer pEVar2;
  type pEVar3;
  size_type __n;
  vector<duckdb::LogicalType,_true> right_types;
  vector<duckdb::LogicalType,_true> left_types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_78;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_58;
  Allocator *local_38;
  
  (this->super_LocalSourceState)._vptr_LocalSourceState =
       (_func_int **)&PTR__IEJoinLocalSourceState_024a6000;
  this->op = op;
  (this->joiner).super_unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>.
  _M_t.super___uniq_ptr_impl<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::IEJoinUnion_*,_std::default_delete<duckdb::IEJoinUnion>_>.
  super__Head_base<0UL,_duckdb::IEJoinUnion_*,_false>._M_head_impl = (IEJoinUnion *)0x0;
  SelectionVector::SelectionVector(&this->true_sel,0x800);
  ExpressionExecutor::ExpressionExecutor(&this->left_executor,context);
  DataChunk::DataChunk(&this->left_keys);
  ExpressionExecutor::ExpressionExecutor(&this->right_executor,context);
  DataChunk::DataChunk(&this->right_keys);
  DataChunk::DataChunk(&this->unprojected);
  this->left_matches = (bool *)0x0;
  this->right_matches = (bool *)0x0;
  pAVar1 = Allocator::Get(context);
  DataChunk::Initialize
            (&this->unprojected,pAVar1,&(op->super_PhysicalRangeJoin).unprojected_types,0x800);
  if (2 < (ulong)(((long)*(pointer *)
                          ((long)&(op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                                  conditions.
                                  super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                  .
                                  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                  ._M_impl.super__Vector_impl_data + 8) -
                   (long)(op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions.
                         super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                         .
                         super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38 = pAVar1;
    if (2 < (ulong)(((long)*(pointer *)
                            ((long)&(op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                                    conditions.
                                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                    .
                                    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                    ._M_impl.super__Vector_impl_data + 8) -
                     (long)(op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions.
                           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                           .
                           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
      __n = 2;
      do {
        this_00 = vector<duckdb::JoinCondition,_true>::operator[]
                            (&(op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions,
                             __n);
        pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(&this_00->left);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&local_58,&pEVar2->return_type);
        pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(&this_00->left);
        ExpressionExecutor::AddExpression(&this->left_executor,pEVar3);
        pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(&this_00->left);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&local_78,&pEVar2->return_type);
        pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(&this_00->right);
        ExpressionExecutor::AddExpression(&this->right_executor,pEVar3);
        __n = __n + 1;
      } while (__n < (ulong)(((long)*(pointer *)
                                     ((long)&(op->super_PhysicalRangeJoin).
                                             super_PhysicalComparisonJoin.conditions.
                                             super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                             .
                                             super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                             ._M_impl.super__Vector_impl_data + 8) -
                              (long)(op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                                    conditions.
                                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                    .
                                    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
    }
    pAVar1 = local_38;
    DataChunk::Initialize
              (&this->left_keys,local_38,(vector<duckdb::LogicalType,_true> *)&local_58,0x800);
    DataChunk::Initialize
              (&this->right_keys,pAVar1,(vector<duckdb::LogicalType,_true> *)&local_78,0x800);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_78);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_58);
  }
  return;
}

Assistant:

explicit IEJoinLocalSourceState(ClientContext &context, const PhysicalIEJoin &op)
	    : op(op), true_sel(STANDARD_VECTOR_SIZE), left_executor(context), right_executor(context),
	      left_matches(nullptr), right_matches(nullptr) {
		auto &allocator = Allocator::Get(context);
		unprojected.Initialize(allocator, op.unprojected_types);

		if (op.conditions.size() < 3) {
			return;
		}

		vector<LogicalType> left_types;
		vector<LogicalType> right_types;
		for (idx_t i = 2; i < op.conditions.size(); ++i) {
			const auto &cond = op.conditions[i];

			left_types.push_back(cond.left->return_type);
			left_executor.AddExpression(*cond.left);

			right_types.push_back(cond.left->return_type);
			right_executor.AddExpression(*cond.right);
		}

		left_keys.Initialize(allocator, left_types);
		right_keys.Initialize(allocator, right_types);
	}